

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O0

size_t anurbs::HilbertCurve<3L>::d(size_t i)

{
  size_t sVar1;
  size_t i_local;
  
  if (i == 0) {
    i_local = 0;
  }
  else if ((i & 1) == 0) {
    sVar1 = g(i - 1);
    i_local = sVar1 % 3;
  }
  else {
    sVar1 = g(i);
    i_local = sVar1 % 3;
  }
  return i_local;
}

Assistant:

static size_t d(const size_t i) noexcept
    {
        if (i == 0) {
            return 0;
        } else if (i % 2 == 0) {
            return g(i - 1) % TDimension;
        } else {
            return g(i) % TDimension;
        }
    }